

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O3

void maybe_free_watcher_list(watcher_list *w,uv_loop_t *loop)

{
  void **ppvVar1;
  watcher_list *pwVar2;
  watcher_list *pwVar3;
  int iVar4;
  undefined4 uVar5;
  watcher_list *pwVar6;
  watcher_list *pwVar7;
  watcher_list *pwVar8;
  watcher_list *old;
  int iVar9;
  void **ppvVar10;
  
  if ((w->iterating != 0) || (w->watchers != (void **)w->watchers[0])) {
    return;
  }
  ppvVar1 = &loop->inotify_watchers;
  pwVar8 = (w->entry).rbe_left;
  pwVar6 = (w->entry).rbe_right;
  if (pwVar8 == (watcher_list *)0x0) {
    pwVar7 = (w->entry).rbe_parent;
    iVar9 = (w->entry).rbe_color;
    if (pwVar6 != (watcher_list *)0x0) goto LAB_0019b7a2;
    pwVar6 = (watcher_list *)0x0;
  }
  else {
    if (pwVar6 != (watcher_list *)0x0) {
      do {
        pwVar8 = pwVar6;
        pwVar6 = (pwVar8->entry).rbe_left;
      } while (pwVar6 != (watcher_list *)0x0);
      pwVar6 = (pwVar8->entry).rbe_right;
      pwVar7 = (pwVar8->entry).rbe_parent;
      iVar9 = (pwVar8->entry).rbe_color;
      if (pwVar6 != (watcher_list *)0x0) {
        (pwVar6->entry).rbe_parent = pwVar7;
      }
      ppvVar10 = ppvVar1;
      if (pwVar7 != (watcher_list *)0x0) {
        ppvVar10 = pwVar7->watchers + ((ulong)((pwVar7->entry).rbe_left != pwVar8) - 4);
      }
      *ppvVar10 = pwVar6;
      if ((pwVar8->entry).rbe_parent == w) {
        pwVar7 = pwVar8;
      }
      pwVar2 = (w->entry).rbe_left;
      pwVar3 = (w->entry).rbe_right;
      iVar4 = (w->entry).rbe_color;
      uVar5 = *(undefined4 *)&(w->entry).field_0x1c;
      (pwVar8->entry).rbe_parent = (w->entry).rbe_parent;
      (pwVar8->entry).rbe_color = iVar4;
      *(undefined4 *)&(pwVar8->entry).field_0x1c = uVar5;
      (pwVar8->entry).rbe_left = pwVar2;
      (pwVar8->entry).rbe_right = pwVar3;
      pwVar2 = (w->entry).rbe_parent;
      ppvVar10 = ppvVar1;
      if (pwVar2 != (watcher_list *)0x0) {
        ppvVar10 = pwVar2->watchers + ((ulong)((pwVar2->entry).rbe_left != w) - 4);
      }
      *ppvVar10 = pwVar8;
      (((w->entry).rbe_left)->entry).rbe_parent = pwVar8;
      pwVar2 = (w->entry).rbe_right;
      if (pwVar2 != (watcher_list *)0x0) {
        (pwVar2->entry).rbe_parent = pwVar8;
      }
      pwVar8 = pwVar7;
      if (pwVar7 == (watcher_list *)0x0) {
        pwVar7 = (watcher_list *)0x0;
      }
      else {
        do {
          pwVar8 = (pwVar8->entry).rbe_parent;
        } while (pwVar8 != (watcher_list *)0x0);
      }
      goto LAB_0019b7c7;
    }
    pwVar7 = (w->entry).rbe_parent;
    iVar9 = (w->entry).rbe_color;
    pwVar6 = pwVar8;
LAB_0019b7a2:
    (pwVar6->entry).rbe_parent = pwVar7;
  }
  ppvVar10 = ppvVar1;
  if (pwVar7 != (watcher_list *)0x0) {
    ppvVar10 = pwVar7->watchers + ((ulong)((pwVar7->entry).rbe_left != w) - 4);
  }
  *ppvVar10 = pwVar6;
LAB_0019b7c7:
  if (iVar9 == 0) {
    while( true ) {
      if ((pwVar6 != (watcher_list *)0x0) && ((pwVar6->entry).rbe_color != 0)) goto LAB_0019ba7e;
      if (pwVar6 == (watcher_list *)*ppvVar1) goto LAB_0019ba79;
      pwVar8 = (pwVar7->entry).rbe_left;
      if (pwVar8 == pwVar6) {
        pwVar8 = (pwVar7->entry).rbe_right;
        if ((pwVar8->entry).rbe_color == 1) {
          (pwVar8->entry).rbe_color = 0;
          (pwVar7->entry).rbe_color = 1;
          pwVar8 = (pwVar7->entry).rbe_right;
          pwVar6 = (pwVar8->entry).rbe_left;
          (pwVar7->entry).rbe_right = pwVar6;
          if (pwVar6 != (watcher_list *)0x0) {
            (pwVar6->entry).rbe_parent = pwVar7;
          }
          pwVar6 = (pwVar7->entry).rbe_parent;
          (pwVar8->entry).rbe_parent = pwVar6;
          ppvVar10 = ppvVar1;
          if (pwVar6 != (watcher_list *)0x0) {
            ppvVar10 = pwVar6->watchers + ((ulong)(pwVar7 != (pwVar6->entry).rbe_left) - 4);
          }
          *ppvVar10 = pwVar8;
          (pwVar8->entry).rbe_left = pwVar7;
          (pwVar7->entry).rbe_parent = pwVar8;
          pwVar8 = (pwVar7->entry).rbe_right;
        }
        pwVar6 = (pwVar8->entry).rbe_left;
        if ((pwVar6 == (watcher_list *)0x0) || ((pwVar6->entry).rbe_color == 0)) {
          pwVar6 = (pwVar8->entry).rbe_right;
          if ((pwVar6 == (watcher_list *)0x0) || ((pwVar6->entry).rbe_color == 0))
          goto LAB_0019b8df;
        }
        else {
          pwVar2 = (pwVar8->entry).rbe_right;
          if ((pwVar2 == (watcher_list *)0x0) || ((pwVar2->entry).rbe_color == 0)) {
            (pwVar6->entry).rbe_color = 0;
            pwVar6 = (pwVar8->entry).rbe_left;
            (pwVar8->entry).rbe_color = 1;
            pwVar2 = (pwVar6->entry).rbe_right;
            (pwVar8->entry).rbe_left = pwVar2;
            if (pwVar2 != (watcher_list *)0x0) {
              (pwVar2->entry).rbe_parent = pwVar8;
            }
            pwVar2 = (pwVar8->entry).rbe_parent;
            (pwVar6->entry).rbe_parent = pwVar2;
            ppvVar10 = ppvVar1;
            if (pwVar2 != (watcher_list *)0x0) {
              ppvVar10 = pwVar2->watchers + ((ulong)(pwVar8 != (pwVar2->entry).rbe_left) - 4);
            }
            *ppvVar10 = pwVar6;
            (pwVar6->entry).rbe_right = pwVar8;
            (pwVar8->entry).rbe_parent = pwVar6;
            pwVar8 = (pwVar7->entry).rbe_right;
          }
        }
        (pwVar8->entry).rbe_color = (pwVar7->entry).rbe_color;
        (pwVar7->entry).rbe_color = 0;
        pwVar8 = (pwVar8->entry).rbe_right;
        if (pwVar8 != (watcher_list *)0x0) {
          (pwVar8->entry).rbe_color = 0;
        }
        pwVar8 = (pwVar7->entry).rbe_right;
        pwVar6 = (pwVar8->entry).rbe_left;
        (pwVar7->entry).rbe_right = pwVar6;
        if (pwVar6 != (watcher_list *)0x0) {
          (pwVar6->entry).rbe_parent = pwVar7;
        }
        pwVar6 = (pwVar7->entry).rbe_parent;
        (pwVar8->entry).rbe_parent = pwVar6;
        ppvVar10 = ppvVar1;
        if (pwVar6 != (watcher_list *)0x0) {
          ppvVar10 = pwVar6->watchers + ((ulong)(pwVar7 != (pwVar6->entry).rbe_left) - 4);
        }
        *ppvVar10 = pwVar8;
        (pwVar8->entry).rbe_left = pwVar7;
        goto LAB_0019ba72;
      }
      if ((pwVar8->entry).rbe_color == 1) {
        (pwVar8->entry).rbe_color = 0;
        (pwVar7->entry).rbe_color = 1;
        pwVar8 = (pwVar7->entry).rbe_left;
        pwVar6 = (pwVar8->entry).rbe_right;
        (pwVar7->entry).rbe_left = pwVar6;
        if (pwVar6 != (watcher_list *)0x0) {
          (pwVar6->entry).rbe_parent = pwVar7;
        }
        pwVar6 = (pwVar7->entry).rbe_parent;
        (pwVar8->entry).rbe_parent = pwVar6;
        ppvVar10 = ppvVar1;
        if (pwVar6 != (watcher_list *)0x0) {
          ppvVar10 = pwVar6->watchers + ((ulong)(pwVar7 != (pwVar6->entry).rbe_left) - 4);
        }
        *ppvVar10 = pwVar8;
        (pwVar8->entry).rbe_right = pwVar7;
        (pwVar7->entry).rbe_parent = pwVar8;
        pwVar8 = (pwVar7->entry).rbe_left;
      }
      pwVar6 = (pwVar8->entry).rbe_left;
      if ((pwVar6 != (watcher_list *)0x0) && ((pwVar6->entry).rbe_color != 0)) goto LAB_0019b966;
      pwVar2 = (pwVar8->entry).rbe_right;
      if ((pwVar2 != (watcher_list *)0x0) && ((pwVar2->entry).rbe_color != 0)) break;
LAB_0019b8df:
      (pwVar8->entry).rbe_color = 1;
      pwVar6 = pwVar7;
      pwVar7 = (pwVar7->entry).rbe_parent;
    }
    if ((pwVar6 == (watcher_list *)0x0) || ((pwVar6->entry).rbe_color == 0)) {
      (pwVar2->entry).rbe_color = 0;
      pwVar6 = (pwVar8->entry).rbe_right;
      (pwVar8->entry).rbe_color = 1;
      pwVar2 = (pwVar6->entry).rbe_left;
      (pwVar8->entry).rbe_right = pwVar2;
      if (pwVar2 != (watcher_list *)0x0) {
        (pwVar2->entry).rbe_parent = pwVar8;
      }
      pwVar2 = (pwVar8->entry).rbe_parent;
      (pwVar6->entry).rbe_parent = pwVar2;
      ppvVar10 = ppvVar1;
      if (pwVar2 != (watcher_list *)0x0) {
        ppvVar10 = pwVar2->watchers + ((ulong)(pwVar8 != (pwVar2->entry).rbe_left) - 4);
      }
      *ppvVar10 = pwVar6;
      (pwVar6->entry).rbe_left = pwVar8;
      (pwVar8->entry).rbe_parent = pwVar6;
      pwVar8 = (pwVar7->entry).rbe_left;
    }
LAB_0019b966:
    (pwVar8->entry).rbe_color = (pwVar7->entry).rbe_color;
    (pwVar7->entry).rbe_color = 0;
    pwVar8 = (pwVar8->entry).rbe_left;
    if (pwVar8 != (watcher_list *)0x0) {
      (pwVar8->entry).rbe_color = 0;
    }
    pwVar8 = (pwVar7->entry).rbe_left;
    pwVar6 = (pwVar8->entry).rbe_right;
    (pwVar7->entry).rbe_left = pwVar6;
    if (pwVar6 != (watcher_list *)0x0) {
      (pwVar6->entry).rbe_parent = pwVar7;
    }
    pwVar6 = (pwVar7->entry).rbe_parent;
    (pwVar8->entry).rbe_parent = pwVar6;
    ppvVar10 = ppvVar1;
    if (pwVar6 != (watcher_list *)0x0) {
      ppvVar10 = pwVar6->watchers + ((ulong)(pwVar7 != (pwVar6->entry).rbe_left) - 4);
    }
    *ppvVar10 = pwVar8;
    (pwVar8->entry).rbe_right = pwVar7;
LAB_0019ba72:
    (pwVar7->entry).rbe_parent = pwVar8;
    pwVar6 = (watcher_list *)*ppvVar1;
LAB_0019ba79:
    if (pwVar6 != (watcher_list *)0x0) {
LAB_0019ba7e:
      (pwVar6->entry).rbe_color = 0;
    }
  }
  inotify_rm_watch(loop->inotify_fd,w->wd);
  uv__free(w);
  return;
}

Assistant:

static void maybe_free_watcher_list(struct watcher_list* w, uv_loop_t* loop) {
  /* if the watcher_list->watchers is being iterated over, we can't free it. */
  if ((!w->iterating) && QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&loop->inotify_watchers), w);
    inotify_rm_watch(loop->inotify_fd, w->wd);
    uv__free(w);
  }
}